

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

strbuf * term_input_data_from_charset(Terminal *term,wchar_t codepage,char *str,wchar_t len)

{
  wchar_t len_00;
  wchar_t *wcstr;
  strbuf *psVar1;
  
  wcstr = (wchar_t *)safemalloc((long)(len * 2),4,0);
  len_00 = mb_to_wc(codepage,L'\0',str,len,wcstr,len * 2);
  psVar1 = term_input_data_from_unicode(term,wcstr,len_00);
  safefree(wcstr);
  return psVar1;
}

Assistant:

static strbuf *term_input_data_from_charset(
    Terminal *term, int codepage, const char *str, int len)
{
    strbuf *buf;

    if (codepage < 0) {
        buf = strbuf_new();
        put_data(buf, str, len);
    } else {
        int widesize = len * 2;        /* allow for UTF-16 surrogates */
        wchar_t *widebuf = snewn(widesize, wchar_t);
        int widelen = mb_to_wc(codepage, 0, str, len, widebuf, widesize);
        buf = term_input_data_from_unicode(term, widebuf, widelen);
        sfree(widebuf);
    }

    return buf;
}